

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O0

bool __thiscall
Refal2::CModuleBuilder::GetNamedQualifier
          (CModuleBuilder *this,CToken *nameToken,CQualifier *qualifier)

{
  bool bVar1;
  byte bVar2;
  pointer ppVar3;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [36];
  undefined4 local_7c;
  iterator local_78;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Refal2::CNamedQualifierInfo>_>
  local_70;
  iterator local_68;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Refal2::CNamedQualifierInfo>_>
  local_60;
  const_iterator i;
  string local_48 [8];
  string qualifierName;
  CQualifier *qualifier_local;
  CToken *nameToken_local;
  CModuleBuilder *this_local;
  
  bVar1 = isModuleExist(this);
  if (!bVar1) {
    __assert_fail("isModuleExist()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ModuleBuilder.cpp"
                  ,0x48,
                  "bool Refal2::CModuleBuilder::GetNamedQualifier(const CToken &, CQualifier &)");
  }
  if (nameToken->type == TT_Qualifier) {
    bVar2 = std::__cxx11::string::empty();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      __assert_fail("!nameToken.word.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ModuleBuilder.cpp"
                    ,0x4a,
                    "bool Refal2::CModuleBuilder::GetNamedQualifier(const CToken &, CQualifier &)");
    }
    std::__cxx11::string::string(local_48,(string *)&nameToken->word);
    MakeLower((string *)local_48);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Refal2::CNamedQualifierInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Refal2::CNamedQualifierInfo>_>_>
         ::find(&this->namedQualifiers,(key_type *)local_48);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Refal2::CNamedQualifierInfo>_>
    ::_Rb_tree_const_iterator(&local_60,&local_68);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Refal2::CNamedQualifierInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Refal2::CNamedQualifierInfo>_>_>
         ::end(&this->namedQualifiers);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Refal2::CNamedQualifierInfo>_>
    ::_Rb_tree_const_iterator(&local_70,&local_78);
    bVar1 = std::operator!=(&local_60,&local_70);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Refal2::CNamedQualifierInfo>_>
               ::operator->(&local_60);
      CQualifier::operator=(qualifier,&(ppVar3->second).qualifier);
    }
    else {
      std::operator+((char *)local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18079b);
      std::operator+(local_a0,(char *)local_c0);
      error(this,nameToken,local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string(local_c0);
    }
    local_7c = 1;
    std::__cxx11::string::~string(local_48);
    return bVar1;
  }
  __assert_fail("nameToken.type == TT_Qualifier",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ModuleBuilder.cpp"
                ,0x49,"bool Refal2::CModuleBuilder::GetNamedQualifier(const CToken &, CQualifier &)"
               );
}

Assistant:

bool CModuleBuilder::GetNamedQualifier( const CToken& nameToken,
	CQualifier& qualifier )
{
	assert( isModuleExist() );
	assert( nameToken.type == TT_Qualifier );
	assert( !nameToken.word.empty() );
	std::string qualifierName = nameToken.word;
	MakeLower( qualifierName );
	CNamedQualifiers::const_iterator i = namedQualifiers.find( qualifierName );
	if( i != namedQualifiers.end() ) {
		qualifier = i->second.qualifier;
		return true;
	}
	error( nameToken, "qualifier `" + nameToken.word + "` wasn't defined" );
	return false;
}